

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O0

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,sc_string_old *s)

{
  int iVar1;
  sc_string_rep *r_00;
  long *in_RDX;
  long *in_RSI;
  sc_string_rep *in_RDI;
  sc_string_rep *r;
  int len;
  sc_string_rep *this_00;
  
  this_00 = in_RDI;
  iVar1 = length((sc_string_old *)0x2f1f3e);
  r_00 = (sc_string_rep *)operator_new(0x10);
  length((sc_string_old *)0x2f1f68);
  sc_string_rep::sc_string_rep(this_00,(int)((ulong)in_RDI >> 0x20));
  strcpy(r_00->str,*(char **)(*in_RSI + 8));
  strcpy(r_00->str + iVar1,*(char **)(*in_RDX + 8));
  sc_string_old((sc_string_old *)in_RDI,r_00);
  return (sc_string_old)this_00;
}

Assistant:

sc_string_old
sc_string_old::operator+( const sc_string_old& s ) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + s.length() + 1 );
    strcpy( r->str, rep->str );
    strcpy( r->str + len, s.rep->str );
    return sc_string_old(r);
}